

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::setNumThreads
          (DefaultThreadPoolProvider *this,int count)

{
  __int_type __i;
  element_type *peVar1;
  size_type sVar2;
  int in_ESI;
  __atomic_base<int> *in_RDI;
  size_t i;
  size_t nToAdd;
  size_t curThreads;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  DefaultThreadPoolProvider *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffffb0;
  shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData> *in_stack_ffffffffffffffb8
  ;
  type *in_stack_ffffffffffffffc8;
  thread *in_stack_ffffffffffffffd0;
  DefaultThreadPoolProvider **local_20;
  
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108b80);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
             ,in_stack_ffffffffffffff88);
  peVar1 = std::
           __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x108b9f);
  local_20 = (DefaultThreadPoolProvider **)
             std::vector<std::thread,_std::allocator<std::thread>_>::size(&peVar1->_threads);
  if ((DefaultThreadPoolProvider **)(long)in_ESI < local_20) {
    lockedFinish(in_stack_ffffffffffffffa0);
    local_20 = (DefaultThreadPoolProvider **)0x0;
  }
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108c0b);
  std::vector<std::thread,_std::allocator<std::thread>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (; local_20 < (DefaultThreadPoolProvider **)(long)in_ESI;
      local_20 = (DefaultThreadPoolProvider **)((long)local_20 + 1)) {
    std::thread::
    thread<void(IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolProvider::*)(std::shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData>),IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolProvider*,std::shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData>&,void>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,local_20,
               in_stack_ffffffffffffffb8);
    peVar1 = std::
             __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x108c82);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              (&peVar1->_threads,(size_type)local_20);
    std::thread::operator=
              ((thread *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (thread *)in_stack_ffffffffffffff88);
    std::thread::~thread((thread *)0x108cad);
  }
  peVar1 = std::
           __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x108cce);
  sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&peVar1->_threads);
  __i = (__int_type)sVar2;
  std::
  __shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x108cef);
  std::__atomic_base<int>::operator=(in_RDI,__i);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x108d0c);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::setNumThreads (int count)
{
    // since we're a private class, the thread pool won't call us if
    // we aren't changing size so no need to check that...

    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    size_t curThreads = _data->_threads.size ();
    size_t nToAdd     = static_cast<size_t> (count);

    if (nToAdd < curThreads)
    {
        // no easy way to only shutdown the n threads at the end of
        // the vector (well, really, guaranteeing they are the ones to
        // be woken up), so just kill all of the threads
        lockedFinish ();
        curThreads = 0;
    }

    _data->_threads.resize (nToAdd);
    for (size_t i = curThreads; i < nToAdd; ++i)
    {
        _data->_threads[i] =
            std::thread (&DefaultThreadPoolProvider::threadLoop, this, _data);
    }
    _data->_threadCount = static_cast<int> (_data->_threads.size ());
}